

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

Change * __thiscall Patch::change_for_root_node(Change *__return_storage_ptr__,Patch *this)

{
  Node *pNVar1;
  _Head_base<0UL,_Text_*,_false> this_00;
  _Head_base<0UL,_Text_*,_false> _Var2;
  uint32_t uVar3;
  Point PVar4;
  Point PVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Point new_start;
  Point old_start;
  Point local_40;
  Point local_38;
  
  pNVar1 = this->root;
  local_38 = pNVar1->old_distance_from_left_ancestor;
  local_40 = pNVar1->new_distance_from_left_ancestor;
  PVar4 = Point::traverse(&local_38,&pNVar1->old_extent);
  PVar5 = Point::traverse(&local_40,&this->root->new_extent);
  pNVar1 = this->root;
  this_00._M_head_impl =
       (pNVar1->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
       super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
       super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       (pNVar1->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
       super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
       super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  if (this_00._M_head_impl == (Text *)0x0) {
    uVar3 = pNVar1->old_text_size_;
  }
  else {
    uVar3 = Text::size(this_00._M_head_impl);
  }
  pNVar1 = this->root->left;
  uVar6 = 0;
  uVar7 = 0;
  if (pNVar1 != (Node *)0x0) {
    uVar7 = pNVar1->old_subtree_text_size;
    uVar6 = pNVar1->new_subtree_text_size;
  }
  __return_storage_ptr__->old_start = local_38;
  __return_storage_ptr__->old_end = PVar4;
  __return_storage_ptr__->new_start = local_40;
  __return_storage_ptr__->new_end = PVar5;
  __return_storage_ptr__->old_text = this_00._M_head_impl;
  __return_storage_ptr__->new_text = _Var2._M_head_impl;
  __return_storage_ptr__->preceding_old_text_size = uVar7;
  __return_storage_ptr__->preceding_new_text_size = uVar6;
  __return_storage_ptr__->old_text_size = uVar3;
  return __return_storage_ptr__;
}

Assistant:

Change Patch::change_for_root_node() {
  Point old_start = root->old_distance_from_left_ancestor;
  Point new_start = root->new_distance_from_left_ancestor;
  Point old_end = old_start.traverse(root->old_extent);
  Point new_end = new_start.traverse(root->new_extent);
  Text *old_text = root->old_text.get();
  Text *new_text = root->new_text.get();
  uint32_t old_text_size = root->old_text_size();
  uint32_t preceding_old_text_size = root->left_subtree_old_text_size();
  uint32_t preceding_new_text_size = root->left_subtree_new_text_size();
  return Change{
    old_start,
    old_end,
    new_start,
    new_end,
    old_text,
    new_text,
    preceding_old_text_size,
    preceding_new_text_size,
    old_text_size,
  };
}